

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

void filemgr_free_func(hash_elem *h)

{
  uint8_t uVar1;
  int iVar2;
  filemgr *file_00;
  __pointer_type pfVar3;
  list *__ptr;
  long in_RDI;
  list *stale_list;
  void *ret;
  filemgr_prefetch_status_t prefetch_state;
  filemgr *file;
  fdb_txn *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  memory_order in_stack_ffffffffffffffe4;
  undefined7 in_stack_ffffffffffffffe8;
  
  file_00 = (filemgr *)(in_RDI + -0xf0);
  uVar1 = atomic_get_uint8_t((atomic<unsigned_char> *)
                             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                             (memory_order)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  atomic_store_uint8_t
            ((atomic<unsigned_char> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (uint8_t)((ulong)in_stack_ffffffffffffffd8 >> 0x38),
             (memory_order)in_stack_ffffffffffffffd8);
  if (uVar1 == '\x01') {
    pthread_join(file_00->prefetch_tid,(void **)&stack0xffffffffffffffe0);
  }
  if (0 < global_config.ncacheblock) {
    pfVar3 = std::atomic<fnamedic_item_*>::load
                       ((atomic<fnamedic_item_*> *)CONCAT17(uVar1,in_stack_ffffffffffffffe8),
                        in_stack_ffffffffffffffe4);
    if (pfVar3 != (__pointer_type)0x0) {
      bcache_remove_dirty_blocks
                ((filemgr *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      bcache_remove_clean_blocks(file_00);
      bcache_remove_file((filemgr *)CONCAT17(uVar1,in_stack_ffffffffffffffe8));
      std::atomic<fnamedic_item_*>::store
                ((atomic<fnamedic_item_*> *)file_00,
                 (__pointer_type)CONCAT17(uVar1,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4
                );
    }
  }
  if (file_00->kv_header != (kvs_header *)0x0) {
    (*file_00->free_kv_header)(file_00);
  }
  wal_remove_transaction
            ((filemgr *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8);
  free((file_00->global_txn).items);
  free((file_00->global_txn).wrapper);
  iVar2 = wal_is_initialized(file_00);
  if (iVar2 != 0) {
    wal_shutdown((filemgr *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 (err_log_callback *)in_stack_ffffffffffffffd8);
    wal_destroy((filemgr *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  free(file_00->wal);
  free(file_00->filename);
  if ((file_00->header).data != (void *)0x0) {
    free((file_00->header).data);
  }
  free(file_00->old_filename);
  free(file_00->new_filename);
  pthread_spin_destroy(&file_00->lock);
  plock_destroy((plock *)CONCAT17(uVar1,in_stack_ffffffffffffffe8));
  pthread_mutex_destroy((pthread_mutex_t *)&file_00->writer_lock);
  if (sb_ops.release != (_func_fdb_status_filemgr_ptr *)0x0) {
    (*sb_ops.release)(file_00);
  }
  filemgr_dirty_update_free
            ((filemgr *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  _free_fhandle_idx((avl_tree *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  pthread_spin_destroy(&file_00->fhandle_idx_lock);
  __ptr = filemgr_get_stale_list(file_00);
  filemgr_clear_stale_list((filemgr *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))
  ;
  filemgr_clear_stale_info_tree(file_00);
  filemgr_clear_mergetree((filemgr *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  free(__ptr);
  free(file_00->config);
  free(file_00);
  return;
}

Assistant:

void filemgr_free_func(struct hash_elem *h)
{
    struct filemgr *file = _get_entry(h, struct filemgr, e);

    filemgr_prefetch_status_t prefetch_state =
                              atomic_get_uint8_t(&file->prefetch_status);

    atomic_store_uint8_t(&file->prefetch_status, FILEMGR_PREFETCH_ABORT);
    if (prefetch_state == FILEMGR_PREFETCH_RUNNING) {
        // prefetch thread was running
        void *ret;
        // wait (the thread must have been created..)
        thread_join(file->prefetch_tid, &ret);
    }

    // remove all cached blocks
    if (global_config.ncacheblock > 0 &&
            file->bcache.load(std::memory_order_relaxed)) {
        bcache_remove_dirty_blocks(file);
        bcache_remove_clean_blocks(file);
        bcache_remove_file(file);
        file->bcache.store(NULL, std::memory_order_relaxed);
    }

    if (file->kv_header) {
        // multi KV intance mode & KV header exists
        file->free_kv_header(file);
    }

    // free global transaction
    wal_remove_transaction(file, &file->global_txn);
    free(file->global_txn.items);
    free(file->global_txn.wrapper);

    // destroy WAL
    if (wal_is_initialized(file)) {
        wal_shutdown(file, NULL);
        wal_destroy(file);
    }
    free(file->wal);

#ifdef _LATENCY_STATS
    for (int x = 0; x < FDB_LATENCY_NUM_STATS; ++x) {
        filemgr_destroy_latency_stat(&file->lat_stats[x]);
    }
#endif // _LATENCY_STATS

    // free filename and header
    free(file->filename);
    if (file->header.data) free(file->header.data);

    // free old/new filename if any
    free(file->old_filename);
    free(file->new_filename);

    // destroy locks
    spin_destroy(&file->lock);

#ifdef __FILEMGR_DATA_PARTIAL_LOCK
    plock_destroy(&file->plock);
#elif defined(__FILEMGR_DATA_MUTEX_LOCK)
    int i;
    for (i=0;i<DLOCK_MAX;++i) {
        mutex_destroy(&file->data_mutex[i]);
    }
#else
    int i;
    for (i=0;i<DLOCK_MAX;++i) {
        spin_destroy(&file->data_spinlock[i]);
    }
#endif //__FILEMGR_DATA_PARTIAL_LOCK

    mutex_destroy(&file->writer_lock.mutex);

    // free superblock
    if (sb_ops.release) {
        sb_ops.release(file);
    }

    // free dirty update index
    filemgr_dirty_update_free(file);

    // free fhandle idx
    _free_fhandle_idx(&file->fhandle_idx);
    spin_destroy(&file->fhandle_idx_lock);

    // free file structure
    struct list *stale_list = filemgr_get_stale_list(file);
    filemgr_clear_stale_list(file);
    filemgr_clear_stale_info_tree(file);
    filemgr_clear_mergetree(file);
    free(stale_list);
    free(file->config);
    free(file);
}